

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O3

int __thiscall CVmObjGramProd::find_literal_in_alts(CVmObjGramProd *this,char *str,size_t len)

{
  char *pcVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  size_t *psVar8;
  bool bVar9;
  
  pcVar1 = (this->super_CVmObject).ext_;
  uVar2 = *(ulong *)(pcVar1 + 0x38);
  if (uVar2 != 0) {
    lVar3 = *(long *)(pcVar1 + 0x30);
    bVar9 = true;
    uVar7 = 0;
    do {
      lVar4 = *(long *)(lVar3 + uVar7 * 8);
      if ((*(int *)(lVar4 + 8) == 0) && (lVar6 = *(long *)(lVar4 + 0x18), lVar6 != 0)) {
        psVar8 = (size_t *)(*(long *)(lVar4 + 0x10) + 0x10);
        do {
          if (((*(char *)((long)psVar8 + -0xe) == '\x03') && (*psVar8 == len)) &&
             (iVar5 = bcmp((void *)psVar8[-1],str,len), iVar5 == 0)) {
            return (uint)bVar9;
          }
          psVar8 = psVar8 + 4;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      uVar7 = uVar7 + 1;
      bVar9 = uVar7 < uVar2;
    } while (uVar7 != uVar2);
  }
  return 0;
}

Assistant:

int CVmObjGramProd::find_literal_in_alts(const char *str, size_t len)
{
    /* 
     *   Scan the surviving alternatives to see if this same literal token
     *   appears in any of them.  If not, it's no longer in use in the
     *   production, so delete it from the dictionary.  
     */
    for (size_t i = 0 ; i < get_ext()->alt_cnt_ ; ++i)
    {
        /* get this item */
        vmgram_alt_info *alt = get_ext()->alts_[i];
        
        /* if it's being deleted, skip it */
        if (alt->del)
            continue;

        /* it's still alive - scan its tokens */
        vmgram_tok_info *tok = alt->toks;
        for (size_t j = 0 ; j < alt->tok_cnt ; ++j, ++tok)
        {
            /* if this is a matching literal, the word is still in use */
            if (tok->typ == VMGRAM_MATCH_LITERAL
                && tok->typinfo.lit.len == len
                && memcmp(tok->typinfo.lit.str, str, len) == 0)
                return TRUE;
        }
    }

    /* didn't find it */
    return FALSE;
}